

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

SquareMatrix<3> * __thiscall pbrt::SquareMatrix<3>::operator*(SquareMatrix<3> *this,Float s)

{
  void *in_RSI;
  SquareMatrix<3> *in_RDI;
  float in_XMM0_Da;
  int j;
  int i;
  int local_14;
  int local_10;
  
  memcpy(in_RDI,in_RSI,0x24);
  for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
    for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
      in_RDI->m[local_10][local_14] = in_XMM0_Da * in_RDI->m[local_10][local_14];
    }
  }
  return in_RDI;
}

Assistant:

operator*(Float s) const {
        SquareMatrix r = *this;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                r.m[i][j] *= s;
        return r;
    }